

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 get_src2(DisasContext_conflict8 *dc,uint insn)

{
  TCGContext_conflict8 *tcg_ctx_00;
  int iVar1;
  uint rs2;
  TCGv_i32 t;
  target_long simm;
  TCGContext_conflict8 *tcg_ctx;
  uint insn_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  if ((insn & 0x2000) == 0) {
    dc_local = (DisasContext_conflict8 *)gen_load_gpr(dc,insn & 0x1f);
  }
  else {
    iVar1 = sign_extend(insn & 0x1fff,0xd);
    dc_local = (DisasContext_conflict8 *)get_temp_tl(dc);
    tcg_gen_movi_i64_sparc64(tcg_ctx_00,(TCGv_i32)dc_local,(long)iVar1);
  }
  return (TCGv_i32)dc_local;
}

Assistant:

static TCGv get_src2(DisasContext *dc, unsigned int insn)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (IS_IMM) { /* immediate */
        target_long simm = GET_FIELDs(insn, 19, 31);
        TCGv t = get_temp_tl(dc);
        tcg_gen_movi_tl(tcg_ctx, t, simm);
        return t;
    } else {      /* register */
        unsigned int rs2 = GET_FIELD(insn, 27, 31);
        return gen_load_gpr(dc, rs2);
    }
}